

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall node::~node(node *this)

{
  tensor *ptVar1;
  
  this->_vptr_node = (_func_int **)&PTR_forward_00109988;
  ptVar1 = this->ret;
  ptVar1->hook = (node *)0x0;
  tensor::tensor_cnt = tensor::tensor_cnt + -1;
  operator_delete(ptVar1,0x20);
  node_cnt = node_cnt + -1;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->grad_fn).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<tensor_*,_std::allocator<tensor_*>_>::~_Vector_base
            (&(this->input).super__Vector_base<tensor_*,_std::allocator<tensor_*>_>);
  return;
}

Assistant:

virtual ~node(){
//        ret->cnt_free--; //记录被释放几次
//        cout<<ret->cnt_free<<" ";
        ret->hook=NULL;

//        if(ret->cnt_free<=0) //因为最后输出不会作为其他输入，所以可能有负数的情况
        delete ret;
        node_cnt--;
    }